

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O2

void rtmidi_open_port(RtMidiPtr device,uint portNumber,char *portName)

{
  string name;
  allocator<char> local_39;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,portName,&local_39);
  (*(code *)**device->ptr)(device->ptr,portNumber,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void rtmidi_open_port (RtMidiPtr device, unsigned int portNumber, const char *portName)
{
    std::string name = portName;
    try {
        ((RtMidi*) device->ptr)->openPort (portNumber, name);

    } catch (const RtMidiError & err) {
        device->ok  = false;
        device->msg = err.what ();
    }
}